

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

Npn_Man_t * Npn_ManStart(char *pFileName)

{
  int iVar1;
  Npn_Obj_t *pNVar2;
  int *piVar3;
  FILE *__stream;
  FILE *pFile;
  Npn_Man_t *p;
  char *pFileName_local;
  
  pFileName_local = (char *)calloc(1,0x20);
  if (pFileName == (char *)0x0) {
    ((Npn_Man_t *)pFileName_local)->nBufferSize = 1000000;
    ((Npn_Man_t *)pFileName_local)->nBufferSize = 100;
    pNVar2 = (Npn_Obj_t *)malloc((long)((Npn_Man_t *)pFileName_local)->nBufferSize << 4);
    ((Npn_Man_t *)pFileName_local)->pBuffer = pNVar2;
    iVar1 = Abc_PrimeCudd(((Npn_Man_t *)pFileName_local)->nBufferSize / 2);
    ((Npn_Man_t *)pFileName_local)->nBins = iVar1;
    piVar3 = (int *)calloc((long)((Npn_Man_t *)pFileName_local)->nBins,4);
    ((Npn_Man_t *)pFileName_local)->pBins = piVar3;
    ((Npn_Man_t *)pFileName_local)->nEntries = 1;
  }
  else {
    __stream = fopen(pFileName,"r");
    if (__stream == (FILE *)0x0) {
      Abc_Print(-1,"Cannot open NPN function file \"%s\".\n",pFileName);
      pFileName_local = (char *)0x0;
    }
    else {
      fclose(__stream);
      iVar1 = Extra_FileSize(pFileName);
      ((Npn_Man_t *)pFileName_local)->nBufferSize = iVar1 / 0x14 << 2;
      pNVar2 = (Npn_Obj_t *)malloc((long)((Npn_Man_t *)pFileName_local)->nBufferSize << 4);
      ((Npn_Man_t *)pFileName_local)->pBuffer = pNVar2;
      iVar1 = Abc_PrimeCudd(((Npn_Man_t *)pFileName_local)->nBufferSize / 2);
      ((Npn_Man_t *)pFileName_local)->nBins = iVar1;
      piVar3 = (int *)calloc((long)((Npn_Man_t *)pFileName_local)->nBins,4);
      ((Npn_Man_t *)pFileName_local)->pBins = piVar3;
      ((Npn_Man_t *)pFileName_local)->nEntries = 1;
      Npn_ManRead((Npn_Man_t *)pFileName_local,pFileName);
    }
  }
  return (Npn_Man_t *)pFileName_local;
}

Assistant:

Npn_Man_t * Npn_ManStart( char * pFileName )
{
    Npn_Man_t * p;
    p = ABC_CALLOC( Npn_Man_t, 1 );
    if ( pFileName == NULL )
    {
        p->nBufferSize = 1000000;
        p->nBufferSize = 100;
        p->pBuffer     = ABC_ALLOC( Npn_Obj_t, p->nBufferSize );
        p->nBins       = Abc_PrimeCudd( p->nBufferSize / 2 );
        p->pBins       = ABC_CALLOC( int, p->nBins );
        p->nEntries    = 1;
    }
    else
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open NPN function file \"%s\".\n", pFileName );
            return NULL;
        }
        fclose( pFile );
        p->nBufferSize = 4 * ( Extra_FileSize(pFileName) / 20 );
        p->pBuffer     = ABC_ALLOC( Npn_Obj_t, p->nBufferSize );
        p->nBins       = Abc_PrimeCudd( p->nBufferSize / 2 );
        p->pBins       = ABC_CALLOC( int, p->nBins );
        p->nEntries    = 1;
        Npn_ManRead( p, pFileName );
    }
    return p;
}